

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

int __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::hash_key(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
           *this,vec<6U,_float> *k)

{
  size_t sVar1;
  hasher<crnlib::vec<6U,_float>_> *in_RDI;
  uint hash;
  vec<6U,_float> *in_stack_ffffffffffffffd8;
  
  sVar1 = hasher<crnlib::vec<6U,_float>_>::operator()(in_RDI,in_stack_ffffffffffffffd8);
  return (uint)((int)sVar1 * -0x61c88647) >> ((byte)*(undefined4 *)(in_RDI + 0x10) & 0x1f);
}

Assistant:

inline int hash_key(const Key& k) const {
    CRNLIB_ASSERT((1U << (32U - m_hash_shift)) == m_values.size());

    uint hash = static_cast<uint>(m_hasher(k));

    // Fibonacci hashing
    hash = (2654435769U * hash) >> m_hash_shift;

    CRNLIB_ASSERT(hash < m_values.size());
    return hash;
  }